

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall ParserTestVariables::Run(ParserTestVariables *this)

{
  Test *pTVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  reference ppEVar6;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  string local_70;
  string local_40;
  Edge *local_20;
  Edge *edge;
  ParserTestVariables *pPStack_10;
  int fail_count;
  ParserTestVariables *this_local;
  
  pPStack_10 = this;
  edge._4_4_ = testing::Test::AssertionFailures(g_current_test);
  ParserTest::AssertParse
            (&this->super_ParserTest,
             "l = one-letter-test\nrule link\n  command = ld $l $extra $with_under -o $out $in\n\nextra = -pthread\nwith_under = -under\nbuild a: link b c\nnested1 = 1\nnested2 = $nested1/2\nbuild supernested: link x\n  extra = $nested2/3\n"
            );
  iVar2 = edge._4_4_;
  iVar4 = testing::Test::AssertionFailures(g_current_test);
  pTVar1 = g_current_test;
  if (iVar2 == iVar4) {
    sVar5 = std::vector<Edge_*,_std::allocator<Edge_*>_>::size
                      (&(this->super_ParserTest).state.edges_);
    bVar3 = testing::Test::Check
                      (pTVar1,sVar5 == 2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                       ,0xa0,"2u == state.edges_.size()");
    if (bVar3) {
      ppEVar6 = std::vector<Edge_*,_std::allocator<Edge_*>_>::operator[]
                          (&(this->super_ParserTest).state.edges_,0);
      pTVar1 = g_current_test;
      local_20 = *ppEVar6;
      Edge::EvaluateCommand_abi_cxx11_(&local_40,local_20,false);
      bVar3 = std::operator==("ld one-letter-test -pthread -under -o a b c",&local_40);
      testing::Test::Check
                (pTVar1,bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0xa3,"\"ld one-letter-test -pthread -under -o a b c\" == edge->EvaluateCommand()")
      ;
      std::__cxx11::string::~string((string *)&local_40);
      pTVar1 = g_current_test;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"nested2",&local_91);
      BindingEnv::LookupVariable(&local_70,&(this->super_ParserTest).state.bindings_,&local_90);
      bVar3 = std::operator==("1/2",&local_70);
      testing::Test::Check
                (pTVar1,bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0xa4,"\"1/2\" == state.bindings_.LookupVariable(\"nested2\")");
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator(&local_91);
      ppEVar6 = std::vector<Edge_*,_std::allocator<Edge_*>_>::operator[]
                          (&(this->super_ParserTest).state.edges_,1);
      pTVar1 = g_current_test;
      local_20 = *ppEVar6;
      Edge::EvaluateCommand_abi_cxx11_(&local_b8,local_20,false);
      bVar3 = std::operator==("ld one-letter-test 1/2/3 -under -o supernested x",&local_b8);
      testing::Test::Check
                (pTVar1,bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
                 ,0xa8,
                 "\"ld one-letter-test 1/2/3 -under -o supernested x\" == edge->EvaluateCommand()");
      std::__cxx11::string::~string((string *)&local_b8);
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
    }
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(ParserTest, Variables) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"l = one-letter-test\n"
"rule link\n"
"  command = ld $l $extra $with_under -o $out $in\n"
"\n"
"extra = -pthread\n"
"with_under = -under\n"
"build a: link b c\n"
"nested1 = 1\n"
"nested2 = $nested1/2\n"
"build supernested: link x\n"
"  extra = $nested2/3\n"));

  ASSERT_EQ(2u, state.edges_.size());
  Edge* edge = state.edges_[0];
  EXPECT_EQ("ld one-letter-test -pthread -under -o a b c",
            edge->EvaluateCommand());
  EXPECT_EQ("1/2", state.bindings_.LookupVariable("nested2"));

  edge = state.edges_[1];
  EXPECT_EQ("ld one-letter-test 1/2/3 -under -o supernested x",
            edge->EvaluateCommand());
}